

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  uint uVar1;
  ulong uVar2;
  HashBucket *pHVar3;
  ulong uVar4;
  HashBucket *size;
  HashBucket *__begin2;
  Fault f;
  Fault local_28;
  
  pHVar3 = oldBuckets.ptr;
  if (0x3fffffff < oldBuckets.size_) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0x99,FAILED,"targetSize < (1 << 30)","\"hash table has reached maximum size\"",
               (char (*) [36])"hash table has reached maximum size");
    Debug::Fault::fatal(&local_28);
  }
  if (oldBuckets.size_ == 0) {
    size = (HashBucket *)0x0;
  }
  else {
    uVar1 = 0x1f;
    if ((uint)oldBuckets.size_ != 0) {
      for (; (uint)oldBuckets.size_ >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    size = *(HashBucket **)(PRIMES + ((uVar1 ^ 0x1fffffe0) * 8 + 0x108));
  }
  if (size <= pHVar3) {
    size = pHVar3;
  }
  heapArray<kj::_::HashBucket>(__return_storage_ptr__,(size_t)size);
  memset(__return_storage_ptr__->ptr,0,(long)size << 3);
  pHVar3 = (HashBucket *)(this + (long)pHVar3 * 8);
  for (; (HashBucket *)this != pHVar3; this = (_ *)((long)this + 8)) {
    if (1 < ((HashBucket *)this)->value) {
      uVar4 = (ulong)((HashBucket *)this)->hash % __return_storage_ptr__->size_;
      while (uVar2 = uVar4 & 0xffffffff, __return_storage_ptr__->ptr[uVar2].value != 0) {
        uVar4 = 0;
        if (uVar2 + 1 != __return_storage_ptr__->size_) {
          uVar4 = uVar2 + 1;
        }
      }
      __return_storage_ptr__->ptr[uVar2] = *(HashBucket *)this;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
      }
    }
  }

  return newBuckets;
}